

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  Framebuffer image;
  World world;
  Group spheres;
  PointLight fill;
  Camera camera;
  Sphere middle;
  Sphere left;
  Tuple4d up;
  Tuple4d to;
  Tuple4d from;
  Plane floor;
  Sphere right;
  PointLight key;
  CheckerMaterial grid;
  RingMaterial ring;
  GradientMaterial gradient;
  StripeMaterial stripes;
  allocator<char> local_a41;
  Framebuffer local_a40;
  shared_ptr<material::Material> local_a28;
  shared_ptr<material::Material> local_a18;
  undefined1 local_a08 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_980;
  shared_ptr<material::Material> local_978;
  shared_ptr<material::Material> local_968;
  World local_958;
  Group local_910;
  undefined1 local_818 [64];
  Camera local_7d8;
  undefined1 local_738 [160];
  undefined1 local_698 [256];
  Primitive local_598;
  Primitive local_4f8;
  Matrix4d local_458;
  CheckerMaterial local_3d8;
  RingMaterial local_2e8;
  GradientMaterial local_1f8;
  StripeMaterial local_108;
  
  ::image::Color::Color((Color *)&local_910,1.0,1.0,1.0);
  scene::World::World(&local_958,(Color *)&local_910);
  ::image::Color::Color((Color *)&local_2e8,0.8431372549019608,0.6980392156862745,1.0);
  ::image::Color::Color
            ((Color *)&local_3d8,0.5764705882352941,0.8470588235294118,0.5803921568627451);
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_910,(Matrix4d *)&local_1f8,0.5,0.5,0.5);
  material::pattern::StripeMaterial::Pattern
            (&local_108,(Color *)&local_2e8,(Color *)&local_3d8,(Matrix4d *)&local_910,0.1,0.9,1.0,
             200.0,0.0,0.0,1.0);
  ::image::Color::Color((Color *)&local_598,0.8,0.0,0.0);
  ::image::Color::Color((Color *)local_738,0.0,0.0,0.8);
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_2e8,(Matrix4d *)&local_3d8,1.5,1.5,1.5);
  math::Matrix4d::rotate_y((Matrix4d *)&local_910,(Matrix4d *)&local_2e8,1.0471966666666666);
  material::pattern::GradientMaterial::Pattern
            (&local_1f8,(Color *)&local_598,(Color *)local_738,(Matrix4d *)&local_910,0.1,0.9,1.0,
             200.0,0.0,0.0,1.0);
  ::image::Color::Color
            ((Color *)&local_4f8,0.8274509803921568,0.8509803921568627,0.9058823529411765);
  ::image::Color::Color((Color *)local_698,0.5529411764705883,0.6,0.7294117647058823);
  math::identity();
  math::Matrix4d::scale((Matrix4d *)&local_598,(Matrix4d *)local_738,0.25,0.25,0.25);
  math::Matrix4d::rotate_x((Matrix4d *)&local_3d8,(Matrix4d *)&local_598,2.094393333333333);
  math::Matrix4d::rotate_y((Matrix4d *)&local_910,(Matrix4d *)&local_3d8,-0.26179916666666664);
  material::pattern::RingMaterial::Pattern
            (&local_2e8,(Color *)&local_4f8,(Color *)local_698,(Matrix4d *)&local_910,0.1,0.9,0.9,
             200.0,0.0,0.0,1.0);
  ::image::Color::Color((Color *)&local_598,0.2,0.2,0.2);
  ::image::Color::Color((Color *)local_738,0.7,0.7,0.7);
  math::identity();
  material::pattern::CheckerMaterial::Pattern
            (&local_3d8,(Color *)&local_598,(Color *)local_738,(Matrix4d *)&local_910,0.1,0.9,0.9,
             200.0,1.0,0.0,1.0);
  math::identity();
  std::make_shared<material::pattern::CheckerMaterial,material::pattern::CheckerMaterial&>
            ((CheckerMaterial *)local_738);
  local_968.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_738._0_8_;
  local_968.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_738._8_8_;
  local_738._0_8_ = (_func_int **)0x0;
  local_738._8_8_ = 0.0;
  geometry::primitive::Plane::Primitive((Plane *)&local_598,(Matrix4d *)&local_910,&local_968);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_968.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_738 + 8));
  math::identity();
  math::Matrix4d::translate((Matrix4d *)&local_910,(Matrix4d *)&local_4f8,-0.5,1.0,0.5);
  std::make_shared<material::pattern::GradientMaterial,material::pattern::GradientMaterial&>
            ((GradientMaterial *)local_698);
  local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_698._0_8_;
  local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_698._8_8_;
  local_698._0_8_ = (_func_int **)0x0;
  local_698._8_8_ = 0.0;
  geometry::primitive::Sphere::Primitive((Sphere *)local_738,(Matrix4d *)&local_910,&local_978);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_978.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_698 + 8));
  math::identity();
  math::Matrix4d::scale((Matrix4d *)local_698,(Matrix4d *)(local_818 + 0x40),0.5,0.5,0.5);
  math::Matrix4d::translate((Matrix4d *)&local_910,(Matrix4d *)local_698,1.2,0.5,-0.5);
  std::make_shared<material::pattern::RingMaterial,material::pattern::RingMaterial&>
            ((RingMaterial *)local_a08);
  local_a08._128_8_ = local_a08._0_8_;
  _Stack_980._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a08._8_8_;
  local_a08._0_8_ = (_func_int **)0x0;
  local_a08._8_8_ = 0.0;
  geometry::primitive::Sphere::Primitive
            ((Sphere *)&local_4f8,(Matrix4d *)&local_910,
             (shared_ptr<material::Material> *)(local_a08 + 0x80));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_980);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a08 + 8));
  math::identity();
  math::Matrix4d::scale((Matrix4d *)local_a08,&local_458,0.33,0.33,0.33);
  math::Matrix4d::translate((Matrix4d *)(local_818 + 0x40),(Matrix4d *)local_a08,-1.5,0.33,-1.5);
  math::Matrix4d::rotate_y((Matrix4d *)&local_910,(Matrix4d *)(local_818 + 0x40),0.7853975);
  std::make_shared<material::pattern::StripeMaterial,material::pattern::StripeMaterial&>
            ((StripeMaterial *)local_818);
  local_a18.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_818._0_8_;
  local_a18.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._8_8_;
  local_818._0_8_ = (element_type *)0x0;
  local_818._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  geometry::primitive::Sphere::Primitive((Sphere *)local_698,(Matrix4d *)&local_910,&local_a18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a18.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_818 + 8));
  math::identity();
  ::image::Color::Color((Color *)&local_458,0.8,0.8,0.8);
  material::ColorMaterial::ColorMaterial
            ((ColorMaterial *)local_a08,(Color *)&local_458,0.1,0.9,0.9,200.0,0.0,0.0,1.0);
  std::make_shared<material::ColorMaterial,material::ColorMaterial>((ColorMaterial *)local_818);
  local_a28.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_818._0_8_;
  local_a28.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_818._8_8_;
  local_818._0_8_ = (_func_int **)0x0;
  local_818._8_8_ = 0.0;
  geometry::Group::Group(&local_910,(Matrix4d *)(local_818 + 0x40),&local_a28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a28.super___shared_ptr<material::Material,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_818 + 8));
  geometry::Group::add_child(&local_910,&local_4f8);
  geometry::Group::add_child(&local_910,(Primitive *)local_698);
  geometry::Group::add_child(&local_910,(Primitive *)local_738);
  scene::World::add_object(&local_958,&local_598);
  scene::World::add_object(&local_958,&local_910.super_Primitive);
  ::image::Color::Color((Color *)local_a08,1.0,1.0,1.0);
  math::point((Tuple4d *)(local_818 + 0x40),-5.0,5.0,-5.0);
  scene::light::PointLight::PointLight
            ((PointLight *)&local_458,(Color *)local_a08,(Tuple4d *)(local_818 + 0x40));
  ::image::Color::Color((Color *)local_a08,1.0,1.0,1.0);
  math::point((Tuple4d *)(local_818 + 0x40),10.0,10.0,-10.0);
  scene::light::PointLight::PointLight
            ((PointLight *)local_818,(Color *)local_a08,(Tuple4d *)(local_818 + 0x40));
  scene::World::add_light(&local_958,(Light *)&local_458);
  scene::World::add_light(&local_958,(Light *)local_818);
  ::image::Camera::Camera((Camera *)(local_818 + 0x40),0x640,800,1.0471966666666666);
  math::point((Tuple4d *)(local_698 + 0xe0),0.0,1.5,-5.0);
  math::point((Tuple4d *)(local_698 + 0xc0),0.0,1.0,0.0);
  math::vector((Tuple4d *)(local_698 + 0xa0),0.0,1.0,0.0);
  math::view((Matrix4d *)local_a08,(Tuple4d *)(local_698 + 0xe0),(Tuple4d *)(local_698 + 0xc0),
             (Tuple4d *)(local_698 + 0xa0));
  ::image::Camera::transform((Camera *)(local_818 + 0x40),(Matrix4d *)local_a08);
  std::chrono::_V2::system_clock::now();
  std::operator<<((ostream *)&std::cout,"Rendering image...\n");
  ::image::Camera::render(&local_a40,(Camera *)(local_818 + 0x40),&local_958);
  std::chrono::_V2::system_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"Finished in ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::operator<<(poVar1," seconds!\n");
  std::__cxx11::string::string<std::allocator<char>>((string *)local_a08,"example.ppm",&local_a41);
  ::image::Framebuffer::save_buffer(&local_a40,(string *)local_a08);
  std::__cxx11::string::~string((string *)local_a08);
  std::operator<<((ostream *)&std::cout,"Press any key to exit.\n");
  ::image::Framebuffer::~Framebuffer(&local_a40);
  geometry::Group::~Group(&local_910);
  geometry::primitive::Primitive::~Primitive((Primitive *)local_698);
  geometry::primitive::Primitive::~Primitive(&local_4f8);
  geometry::primitive::Primitive::~Primitive((Primitive *)local_738);
  geometry::primitive::Primitive::~Primitive(&local_598);
  scene::World::~World(&local_958);
  return 0;
}

Assistant:

int main()
{
    // create world
    scene::World world{};

    // setup materials
    material::pattern::StripeMaterial stripes{image::Color{215 / 255.0, 178 / 255.0, 255 / 255.0}, image::Color{147 / 255.0, 216 / 255.0, 148 / 255.0}, math::identity().scale(0.5, 0.5, 0.5), 0.1, 0.9, 1, 200};
    material::pattern::GradientMaterial gradient{image::Color{0.8, 0, 0}, image::Color{0, 0, 0.8}, math::identity().scale(1.5, 1.5, 1.5).rotate_y(constants::PI / 3), 0.1, 0.9, 1, 200};
    material::pattern::RingMaterial ring{image::Color{211 / 255.0, 217 / 255.0, 231 / 255.0}, image::Color{141 / 255.0, 153 / 255.0, 186 / 255.0}, math::identity().scale(0.25, 0.25, 0.25).rotate_x(constants::PI / 1.5).rotate_y(-constants::PI / 12)};
    material::pattern::CheckerMaterial grid{image::Color{0.2, 0.2, 0.2}, image::Color{0.7, 0.7, 0.7}, math::identity(), 0.1, 0.9, 0.9, 200, 1};

    // create objects with materials
    geometry::primitive::Plane floor{math::identity(), std::make_shared<material::pattern::CheckerMaterial>(grid)};
    geometry::primitive::Sphere middle{math::identity().translate(-0.5, 1, 0.5), std::make_shared<material::pattern::GradientMaterial>(gradient)};
    geometry::primitive::Sphere right{math::identity().scale(0.5, 0.5, 0.5).translate(1.2, 0.5, -0.5), std::make_shared<material::pattern::RingMaterial>(ring)};
    geometry::primitive::Sphere left{math::identity().scale(0.33, 0.33, 0.33).translate(-1.5, 0.33, -1.5).rotate_y(constants::PI / 4), std::make_shared<material::pattern::StripeMaterial>(stripes)};
    
    // group spheres together
    geometry::Group spheres{};
    spheres.add_child(&right);
    spheres.add_child(&left);
    spheres.add_child(&middle);

    // add objects to scene
    world.add_object(floor);
    world.add_object(spheres);

    // create lights
    scene::light::PointLight key{image::Color{1, 1, 1}, math::point(-5, 5, -5)};
    scene::light::PointLight fill{image::Color{1, 1, 1}, math::point(10, 10, -10)};

    // add lights to scene
    world.add_light(key);
    world.add_light(fill);

    // configure camera
    image::Camera camera{1600, 800, constants::PI / 3};
    math::Tuple4d from = math::point(0, 1.5, -5);
    math::Tuple4d to = math::point(0, 1, 0);
    math::Tuple4d up = math::vector(0, 1, 0);
    camera.transform(math::view(from, to, up));

    // render scene to buffer
    auto start = std::chrono::high_resolution_clock::now();
    std::cout << "Rendering image...\n";
    image::Framebuffer image = camera.render(world);
    auto stop = std::chrono::high_resolution_clock::now();
    std::cout << "Finished in " << (std::chrono::duration_cast<std::chrono::seconds>(stop - start)).count() << " seconds!\n";

    // write buffer to file
    image.save_buffer("example.ppm");
    std::cout << "Press any key to exit.\n";

    return 0;
}